

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O1

llama_sampler *
llama_sampler_init_dry
          (llama_vocab *vocab,int32_t context_size,float dry_multiplier,float dry_base,
          int32_t dry_allowed_length,int32_t dry_penalty_last_n,char **seq_breakers,
          size_t num_breakers)

{
  char *__s;
  void *pvVar1;
  bool bVar2;
  bool bVar3;
  pointer __s1;
  pointer piVar4;
  uint32_t uVar5;
  long lVar6;
  _Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false> _Var7;
  int32_t *piVar8;
  llama_sampler *plVar9;
  ulong uVar10;
  int iVar11;
  size_t sVar12;
  size_t __n;
  _Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false> it;
  size_type sVar13;
  bool bVar14;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>_>
  pVar15;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> tokenization;
  string sequence_break;
  string word;
  unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  processed_breakers;
  key_type local_14c;
  allocator_type local_145;
  int32_t local_144;
  llama_vocab *local_140;
  string local_138;
  vector<int,_std::allocator<int>_> local_118;
  long *local_100;
  ulong local_f8;
  long local_f0 [2];
  ulong local_e0;
  int32_t local_d4;
  int32_t local_d0;
  int32_t local_cc;
  size_t local_c8;
  char **local_c0;
  string local_b8;
  size_t local_98;
  ulong local_90;
  float local_88;
  float local_78;
  _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  local_68;
  
  bVar14 = dry_penalty_last_n != 0;
  local_144 = 0;
  if (0 < dry_penalty_last_n) {
    local_144 = dry_penalty_last_n;
  }
  if (dry_penalty_last_n == -1) {
    local_144 = context_size;
  }
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  bVar2 = 1.0 <= dry_base;
  bVar3 = dry_multiplier != 0.0;
  local_140 = vocab;
  local_d4 = context_size;
  local_d0 = dry_allowed_length;
  local_cc = dry_penalty_last_n;
  local_c8 = num_breakers;
  local_c0 = seq_breakers;
  local_88 = dry_multiplier;
  local_78 = dry_base;
  if ((((bVar3 && bVar2) && bVar14) && (seq_breakers != (char **)0x0)) && (num_breakers != 0)) {
    sVar12 = 0;
    do {
      __s = local_c0[sVar12];
      if ((__s == (char *)0x0) || (*__s == '\0')) {
        llama_log_internal(GGML_LOG_LEVEL_WARN,
                           "skipping null or empty DRY sequence breaker at index %zu\n",sVar12);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,__s,(allocator<char> *)&local_b8);
        if (local_f8 == 0) {
          llama_log_internal(GGML_LOG_LEVEL_WARN,"skipping empty DRY sequence breaker\n");
        }
        else {
          if (0x28 < local_f8) {
            llama_log_internal(GGML_LOG_LEVEL_WARN,
                               "truncating DRY sequence breaker to %d characters\n",0x28);
            std::__cxx11::string::resize((ulong)&local_100,'(');
          }
          local_14c = 0;
          uVar5 = llama_vocab::n_tokens(local_140);
          if (0 < (int)uVar5) {
            do {
              local_98 = sVar12;
              local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = local_14c;
              __l._M_len = 1;
              __l._M_array = (iterator)&local_118;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_138,__l,&local_145);
              llama_vocab::detokenize_abi_cxx11_
                        (&local_b8,local_140,(vector<int,_std::allocator<int>_> *)&local_138,true);
              if (local_138._M_dataplus._M_p != (pointer)0x0) {
                operator_delete(local_138._M_dataplus._M_p,
                                local_138.field_2._M_allocated_capacity -
                                (long)local_138._M_dataplus._M_p);
              }
              lVar6 = std::__cxx11::string::find((char *)&local_b8,(ulong)local_100,0);
              sVar13 = local_b8._M_string_length;
              if (lVar6 == -1) {
                local_e0 = local_f8;
                lVar6 = std::__cxx11::string::find
                                  ((char)&local_b8,(ulong)(uint)(int)(char)*local_100);
                if (lVar6 != -1) {
                  local_90 = sVar13;
                  do {
                    uVar10 = 1;
                    if (1 < local_e0) {
                      do {
                        if (sVar13 <= lVar6 + uVar10) break;
                        if (*(char *)(CONCAT44(local_b8._M_dataplus._M_p._4_4_,
                                               local_b8._M_dataplus._M_p._0_4_) + lVar6 + uVar10) !=
                            *(char *)((long)local_100 + uVar10)) goto LAB_0020af92;
                        uVar10 = uVar10 + 1;
                      } while (local_e0 != uVar10);
                    }
                    std::__cxx11::string::substr((ulong)&local_138,(ulong)&local_100);
                    llama_vocab::tokenize(&local_118,local_140,&local_138,false,false);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_138._M_dataplus._M_p != &local_138.field_2) {
                      operator_delete(local_138._M_dataplus._M_p,
                                      local_138.field_2._M_allocated_capacity + 1);
                    }
                    if (0x50 < (ulong)((long)local_118.super__Vector_base<int,_std::allocator<int>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      CONCAT44(local_118.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._4_4_,
                                               (int)local_118.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start))) {
                      std::vector<int,_std::allocator<int>_>::resize
                                ((vector<int,_std::allocator<int>_> *)&local_118,0x14);
                    }
                    pVar15 = std::
                             _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                             ::equal_range(&local_68,&local_14c);
                    piVar4 = local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish;
                    _Var7._M_cur = (__node_type *)
                                   pVar15.first.
                                   super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                   ._M_cur;
                    if ((_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                         )_Var7._M_cur !=
                        pVar15.second.
                        super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                        ._M_cur.
                        super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                       ) {
                      __s1 = (pointer)CONCAT44(local_118.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._4_4_,
                                               (int)local_118.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start);
                      __n = (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)__s1;
                      do {
                        pvVar1 = *(void **)((long)&((_Var7._M_cur)->
                                                                                                      
                                                  super__Hash_node_value<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_storage._M_storage + 8);
                        if ((__n == *(long *)((long)&((_Var7._M_cur)->
                                                                                                          
                                                  super__Hash_node_value<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_storage._M_storage + 0x10) - (long)pvVar1) &&
                           ((piVar4 == __s1 || (iVar11 = bcmp(__s1,pvVar1,__n), iVar11 == 0))))
                        goto LAB_0020af62;
                        _Var7._M_cur = (__node_type *)((_Var7._M_cur)->super__Hash_node_base)._M_nxt
                        ;
                      } while ((_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                )_Var7._M_cur !=
                               pVar15.second.
                               super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                               ._M_cur.
                               super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                              );
                    }
                    std::
                    _Hashtable<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                    ::_M_emplace<int&,std::vector<int,std::allocator<int>>&>
                              ((_Hashtable<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                                *)&local_68,0,&local_14c,&local_118);
LAB_0020af62:
                    pvVar1 = (void *)CONCAT44(local_118.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start._4_4_,
                                              (int)local_118.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start);
                    sVar13 = local_90;
                    if (pvVar1 != (void *)0x0) {
                      operator_delete(pvVar1,(long)local_118.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_end_of_storage
                                             - (long)pvVar1);
                      sVar13 = local_90;
                    }
LAB_0020af92:
                    lVar6 = std::__cxx11::string::find
                                      ((char)&local_b8,(ulong)(uint)(int)(char)*local_100);
                  } while (lVar6 != -1);
                }
              }
              else {
                local_138._M_dataplus._M_p = (pointer)0x0;
                local_138._M_string_length = 0;
                local_138.field_2._M_allocated_capacity = 0;
                std::
                _Hashtable<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                ::_M_emplace<int&,std::vector<int,std::allocator<int>>>
                          ((_Hashtable<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                            *)&local_68,0,&local_14c,&local_138);
                if (local_138._M_dataplus._M_p != (pointer)0x0) {
                  operator_delete(local_138._M_dataplus._M_p,
                                  local_138.field_2._M_allocated_capacity -
                                  (long)local_138._M_dataplus._M_p);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_b8._M_dataplus._M_p._4_4_,local_b8._M_dataplus._M_p._0_4_) !=
                  &local_b8.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_b8._M_dataplus._M_p._4_4_,
                                         local_b8._M_dataplus._M_p._0_4_),
                                local_b8.field_2._M_allocated_capacity + 1);
              }
              iVar11 = local_14c + 1;
              local_14c = iVar11;
              uVar5 = llama_vocab::n_tokens(local_140);
              sVar12 = local_98;
            } while (iVar11 < (int)uVar5);
          }
        }
        if (local_100 != local_f0) {
          operator_delete(local_100,local_f0[0] + 1);
        }
      }
      sVar12 = sVar12 + 1;
    } while (sVar12 != local_c8);
  }
  piVar8 = (int32_t *)operator_new(0xd8);
  *piVar8 = local_d4;
  piVar8[1] = (int32_t)local_88;
  piVar8[2] = (int32_t)local_78;
  piVar8[3] = local_d0;
  piVar8[4] = local_cc;
  std::
  _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::_Hashtable((_Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                *)(piVar8 + 6),&local_68);
  if ((bVar3 && bVar2) && bVar14) {
    local_b8._M_dataplus._M_p._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)(piVar8 + 0x14),(long)local_144,
               (value_type_conflict3 *)&local_b8,(allocator_type *)&local_100);
  }
  else {
    (((vector<int,_std::allocator<int>_> *)(piVar8 + 0x14))->
    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    piVar8[0x16] = 0;
    piVar8[0x17] = 0;
    piVar8[0x18] = 0;
    piVar8[0x19] = 0;
  }
  piVar8[0x1a] = 0;
  piVar8[0x1b] = 0;
  piVar8[0x1c] = 0;
  piVar8[0x1d] = 0;
  piVar8[0x22] = 0;
  piVar8[0x23] = 0;
  piVar8[0x24] = 0;
  piVar8[0x25] = 0;
  piVar8[0x26] = 0;
  piVar8[0x27] = 0;
  *(int32_t **)(piVar8 + 0x1a) = piVar8 + 0x26;
  piVar8[0x1c] = 1;
  piVar8[0x1d] = 0;
  piVar8[0x1e] = 0;
  piVar8[0x1f] = 0;
  piVar8[0x20] = 0;
  piVar8[0x21] = 0;
  piVar8[0x22] = 0x3f800000;
  piVar8[0x24] = 0;
  piVar8[0x25] = 0;
  piVar8[0x26] = 0;
  piVar8[0x27] = 0;
  if ((bVar3 && bVar2) && bVar14) {
    *(long *)(piVar8 + 0x28) = (long)local_144;
    piVar8[0x2a] = 0;
    piVar8[0x2b] = 0;
    piVar8[0x2c] = 0;
    piVar8[0x2d] = 0;
    piVar8[0x2e] = 0;
    piVar8[0x2f] = 0;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)(piVar8 + 0x30),(long)local_144,
               (allocator_type *)&local_138);
  }
  else {
    piVar8[0x30] = 0;
    piVar8[0x31] = 0;
    piVar8[0x32] = 0;
    piVar8[0x33] = 0;
    piVar8[0x2c] = 0;
    piVar8[0x2d] = 0;
    piVar8[0x2e] = 0;
    piVar8[0x2f] = 0;
    piVar8[0x28] = 0;
    piVar8[0x29] = 0;
    piVar8[0x2a] = 0;
    piVar8[0x2b] = 0;
    piVar8[0x34] = 0;
    piVar8[0x35] = 0;
  }
  plVar9 = (llama_sampler *)operator_new(0x10);
  plVar9->iface = &llama_sampler_dry_i;
  plVar9->ctx = piVar8;
  std::
  _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::~_Hashtable(&local_68);
  return plVar9;
}

Assistant:

struct llama_sampler * llama_sampler_init_dry(const struct llama_vocab * vocab, int32_t context_size, float dry_multiplier, float dry_base, int32_t dry_allowed_length, int32_t dry_penalty_last_n, const char** seq_breakers, size_t num_breakers) {
    int32_t effective_dry_penalty_last_n = (dry_penalty_last_n == -1) ? context_size : std::max(dry_penalty_last_n, 0);
    std::unordered_multimap<llama_token, std::vector<llama_token>> processed_breakers;
    const int MAX_CHAR_LEN = 40;
    const int MAX_SEQ_LEN = 20;

    const bool dry_enabled = (dry_multiplier != 0.0f && dry_base >= 1.0f && dry_penalty_last_n != 0);

    if (dry_enabled && seq_breakers != nullptr && num_breakers > 0) {
        // Process sequence breakers
        for (size_t i = 0; i < num_breakers; ++i) {
            if (seq_breakers[i] == nullptr || std::strlen(seq_breakers[i]) == 0) {
                LLAMA_LOG_WARN("skipping null or empty DRY sequence breaker at index %zu\n", i);
                continue;
            }

            std::string sequence_break(seq_breakers[i]);
            if (sequence_break.empty()) {
                LLAMA_LOG_WARN("skipping empty DRY sequence breaker\n");
                continue;
            }

            if (sequence_break.size() > MAX_CHAR_LEN) {
                LLAMA_LOG_WARN("truncating DRY sequence breaker to %d characters\n", MAX_CHAR_LEN);
                sequence_break.resize(MAX_CHAR_LEN);
            }

            get_overlapping_token_sequences(*vocab, sequence_break, processed_breakers, MAX_SEQ_LEN);
        }
    }

    return llama_sampler_init(
        /* .iface = */ &llama_sampler_dry_i,
        /* .ctx   = */ new llama_sampler_dry {
            /* .total_context_size     = */ context_size,
            /* .dry_multiplier         = */ dry_multiplier,
            /* .dry_base               = */ dry_base,
            /* .dry_allowed_length     = */ dry_allowed_length,
            /* .dry_penalty_last_n     = */ dry_penalty_last_n,
            /* .dry_processed_breakers = */ std::move(processed_breakers),
            /* .dry_repeat_count       = */ dry_enabled ? std::vector<int>(effective_dry_penalty_last_n, 0) : std::vector<int>{},
            /* .dry_max_token_repeat   = */ {},
            /* .last_tokens            = */ dry_enabled ? ring_buffer<llama_token>(effective_dry_penalty_last_n) : ring_buffer<llama_token>(0),
        }
    );
}